

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> kj::joinPromisesFailFast(Array<kj::Promise<void>_> *promises,SourceLocation location)

{
  kj *this;
  size_t size;
  Array<kj::Promise<void>_> *in_RSI;
  ArrayJoinBehavior local_78 [4];
  Array<kj::_::ExceptionOr<kj::_::Void>_> local_68;
  anon_class_1_0_00000001 local_49;
  Mapper<kj::Array<kj::Promise<void>_>_&> local_48;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_40;
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> local_28;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_20;
  Array<kj::Promise<void>_> *local_18;
  Array<kj::Promise<void>_> *promises_local;
  
  local_18 = in_RSI;
  promises_local = promises;
  _::Mapper<kj::Array<kj::Promise<void>_>_&>::Mapper(&local_48,in_RSI);
  _::Mapper<kj::Array<kj::Promise<void>_>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:3000:7)>
            (&local_40,&local_48,&local_49);
  this = (kj *)Array<kj::Promise<void>_>::size(local_18);
  heapArray<kj::_::ExceptionOr<kj::_::Void>>(&local_68,this,size);
  local_78[0] = EAGER;
  _::
  allocPromise<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((_ *)&local_28,&local_40,&local_68,&location,local_78);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::Own<kj::_::ArrayJoinPromiseNode<void>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_20,&local_28);
  _::PromiseNode::to<kj::Promise<void>>((PromiseNode *)promises,(OwnPromiseNode *)&local_20);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_20);
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer>::~Own(&local_28);
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array(&local_68);
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Array(&local_40);
  return (PromiseBase)(PromiseBase)promises;
}

Assistant:

Promise<void> joinPromisesFailFast(Array<Promise<void>>&& promises, SourceLocation location) {
  return _::PromiseNode::to<Promise<void>>(_::allocPromise<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return _::PromiseNode::from(kj::mv(p)); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size()), location,
      _::ArrayJoinBehavior::EAGER));
}